

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_circle_sector
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_68;
  float local_48;
  float fStack_44;
  
  iVar5 = start_angle;
  if (start_angle < end_angle) {
    iVar5 = end_angle;
  }
  fVar8 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar6 = -0.5 / fVar8 + 1.0;
    fVar6 = fVar6 * fVar6;
    fVar6 = acosf(fVar6 + fVar6 + -1.0);
    fVar6 = ceilf(6.2831855 / fVar6);
    iVar3 = (int)((fVar6 * (float)(iVar5 - start_angle)) / 360.0);
    segments = 4;
    if (0 < iVar3) {
      segments = iVar3;
    }
  }
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar4 = prVar1->current_buffer;
  prVar2 = prVar1->vertex_buffers;
  if (prVar2[lVar4].elements_count * 4 <= segments * 3 + prVar2[lVar4].v_counter) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  if (0 < segments) {
    local_68 = (float)start_angle;
    lVar4 = (long)segments;
    fStack_44 = center.y;
    do {
      rf_gfx_color4ub(color.r,color.g,color.b,color.a);
      local_48 = center.x;
      rf_gfx_vertex3f(local_48,fStack_44,((rf__ctx->field_0).current_batch)->current_depth);
      fVar6 = sinf(local_68 * 0.017453292);
      fVar7 = cosf(local_68 * 0.017453292);
      rf_gfx_vertex3f(fVar6 * fVar8 + local_48,fVar7 * fVar8 + fStack_44,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      local_68 = local_68 + (float)(iVar5 - start_angle) / (float)segments;
      fVar6 = sinf(local_68 * 0.017453292);
      fVar7 = cosf(local_68 * 0.017453292);
      rf_gfx_vertex3f(fVar6 * fVar8 + local_48,fVar7 * fVar8 + fStack_44,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088
        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(3*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }
    rf_gfx_end();
}